

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall Display::calculateStates(Display *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  tuple<int,_char> local_c8;
  tuple<int,_char> tuple_to_print;
  int local_98;
  int sourrounding_mine_count;
  int color;
  char to_print;
  int y;
  int local_7c;
  undefined1 local_78 [4];
  int x;
  Minefield mfield;
  Display *this_local;
  
  mfield._96_8_ = this;
  Controller::getMinefield((Minefield *)local_78,&this->controller);
  for (local_7c = 0; iVar1 = local_7c, iVar3 = Minefield::getXDimension((Minefield *)local_78),
      iVar1 < iVar3; local_7c = local_7c + 1) {
    for (color = 0; iVar1 = color, iVar3 = Minefield::getYDimension((Minefield *)local_78),
        iVar1 < iVar3; color = color + 1) {
      bVar2 = Minefield::isOpen((Minefield *)local_78,local_7c,color);
      if (bVar2) {
        local_98 = Minefield::getSorroundingMineCount((Minefield *)local_78,local_7c,color);
        std::__cxx11::to_string((string *)&tuple_to_print,local_98);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        sourrounding_mine_count._3_1_ = *pcVar4;
        std::__cxx11::string::~string((string *)&tuple_to_print);
        if (sourrounding_mine_count._3_1_ == '0') {
          sourrounding_mine_count._3_1_ = ' ';
        }
        bVar2 = Minefield::isMine((Minefield *)local_78,local_7c,color);
        if (bVar2) {
          local_98 = 0xb;
          sourrounding_mine_count._3_1_ = 'X';
        }
      }
      else {
        bVar2 = Minefield::isGameLost((Minefield *)local_78);
        if (((!bVar2) || (bVar2 = Minefield::isMine((Minefield *)local_78,local_7c,color), !bVar2))
           || (bVar2 = Minefield::isFlagged((Minefield *)local_78,local_7c,color), bVar2)) {
          bVar2 = Minefield::isFlagged((Minefield *)local_78,local_7c,color);
          if (bVar2) {
            local_98 = 0;
            sourrounding_mine_count._3_1_ = '?';
            bVar2 = Minefield::isGameEnded((Minefield *)local_78);
            if ((bVar2) && (bVar2 = Minefield::isMine((Minefield *)local_78,local_7c,color), !bVar2)
               ) {
              local_98 = 0xb;
            }
          }
          else {
            local_98 = 10;
            sourrounding_mine_count._3_1_ = '*';
          }
        }
        else {
          local_98 = 0xb;
          sourrounding_mine_count._3_1_ = 'X';
        }
      }
      std::make_tuple<int&,char&>((int *)&local_c8,(char *)&local_98);
      pvVar5 = std::
               vector<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>,_std::allocator<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>_>_>
               ::operator[](&this->state,(long)local_7c);
      pvVar6 = std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>::
               operator[](pvVar5,(long)color);
      bVar2 = std::operator!=(pvVar6,&local_c8);
      if (bVar2) {
        pvVar5 = std::
                 vector<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>,_std::allocator<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>_>_>
                 ::operator[](&this->state,(long)local_7c);
        pvVar6 = std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>::
                 operator[](pvVar5,(long)color);
        std::tuple<int,_char>::operator=(pvVar6,&local_c8);
      }
    }
  }
  Minefield::~Minefield((Minefield *)local_78);
  return;
}

Assistant:

void Display::calculateStates() {
    auto mfield = controller.getMinefield();
    
    for (int x = 0; x < mfield.getXDimension(); x++) {
        for (int y = 0; y < mfield.getYDimension(); y++) {
            char to_print;
            int color;
            if (mfield.isOpen(x, y)) {
                auto sourrounding_mine_count = mfield.getSorroundingMineCount(x, y);
                color = sourrounding_mine_count;
                to_print = std::to_string(sourrounding_mine_count).c_str()[0];
                if ('0' == to_print) {
                    to_print = ' ';
                }

                if (mfield.isMine(x, y)) {
                    color = 11;
                    to_print = 'X';
                }
            } else if (mfield.isGameLost() && mfield.isMine(x, y) && !mfield.isFlagged(x, y)) {
                // mark only unflagged mines
                color = 11;
                to_print = 'X';
            } else if (mfield.isFlagged(x, y)) {
                color = 0;
                to_print = '?';
                if (mfield.isGameEnded() && !mfield.isMine(x, y)) {
                    // incorrect mine -> make red
                    color = 11;
                }
            } else {
                color = 10;
                to_print = '*';
            }

            auto tuple_to_print = std::make_tuple(color, to_print);
            if (state[x][y] != tuple_to_print) {
                state[x][y] = tuple_to_print;
            }
        }
    }
}